

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteSpherical::IntStateGatherReactions
          (ChLinkRevoluteSpherical *this,uint off_L,ChVectorDynamic<> *L)

{
  Scalar SVar1;
  int iVar2;
  Scalar *pSVar3;
  
  iVar2 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar2 != '\0') {
    SVar1 = this->m_multipliers[0];
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,(ulong)off_L
                       );
    *pSVar3 = SVar1;
    SVar1 = this->m_multipliers[1];
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                        (ulong)(off_L + 1));
    *pSVar3 = SVar1;
  }
  return;
}

Assistant:

void ChLinkRevoluteSpherical::IntStateGatherReactions(const unsigned int off_L, ChVectorDynamic<>& L) {
    if (!this->IsActive())
        return;

    L(off_L + 0) = m_multipliers[0];
    L(off_L + 1) = m_multipliers[1];
}